

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_inverse(mat4 m)

{
  undefined1 auVar1 [16];
  mat4 *in_RDI;
  float fVar2;
  float fVar5;
  float fVar6;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  undefined8 in_stack_00000028;
  float in_stack_00000030;
  float in_stack_00000034;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  float local_18;
  
  fVar2 = (float)in_stack_00000040;
  fVar5 = (float)((ulong)in_stack_00000040 >> 0x20);
  fVar6 = (float)((ulong)in_stack_00000038 >> 0x20);
  fVar26 = in_stack_00000010 * in_stack_00000024;
  fVar27 = in_stack_00000010 * in_stack_00000018;
  fVar12 = in_stack_00000008 * in_stack_0000001c;
  fVar21 = in_stack_00000020 * in_stack_00000008;
  fVar23 = in_stack_00000024 * in_stack_00000008;
  fVar15 = (float)in_stack_00000028;
  fVar16 = (float)((ulong)in_stack_00000028 >> 0x20);
  fVar25 = in_stack_0000000c * in_stack_00000018;
  fVar29 = in_stack_0000000c * in_stack_00000024;
  fVar30 = in_stack_0000000c * in_stack_00000020;
  local_18 = (float)in_stack_00000038;
  fVar17 = in_stack_0000001c * in_stack_00000010;
  fVar18 = in_stack_00000018 * in_stack_00000014;
  fVar19 = in_stack_00000014 * in_stack_0000001c;
  fVar20 = in_stack_00000014 * in_stack_00000020;
  fVar22 = -fVar21;
  fVar24 = -fVar23;
  fVar13 = -fVar29;
  fVar14 = -fVar30;
  fVar10 = -fVar26;
  fVar11 = -fVar27;
  fVar7 = -fVar20 * fVar15 * fVar6 +
          in_stack_00000030 * -fVar19 * local_18 +
          ((fVar16 * fVar10 * local_18 +
           ((in_stack_00000034 * fVar11 * fVar6 +
            fVar15 * fVar13 * fVar2 +
            in_stack_00000034 * fVar14 * local_18 +
            ((fVar24 * in_stack_00000030 * fVar6 +
             fVar16 * fVar22 * fVar5 +
             ((fVar16 * fVar20 * local_18 +
              fVar15 * fVar19 * fVar2 +
              in_stack_00000030 * fVar18 * fVar6 +
              fVar15 * fVar26 * fVar6 +
              in_stack_00000034 * fVar17 * local_18 +
              fVar16 * fVar27 * fVar5 +
              in_stack_00000030 * fVar29 * local_18 +
              fVar30 * fVar15 * fVar5 +
              in_stack_00000034 * fVar25 * fVar2 +
              fVar23 * fVar16 * fVar2 +
              fVar12 * in_stack_00000030 * fVar5 + fVar21 * in_stack_00000034 * fVar6) -
             in_stack_00000034 * fVar12 * fVar2)) - in_stack_00000030 * fVar25 * fVar5)) -
           fVar15 * fVar17 * fVar5)) - fVar16 * fVar18 * fVar2);
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    auVar8._0_4_ = (-(in_stack_00000020 * fVar16) * fVar5 +
                   -(in_stack_0000001c * in_stack_00000034) * fVar2 +
                   fVar2 * in_stack_00000024 * fVar16 +
                   in_stack_00000030 * in_stack_0000001c * fVar5 +
                   fVar6 * in_stack_00000020 * in_stack_00000034) -
                   fVar6 * in_stack_00000024 * in_stack_00000030;
    auVar8._4_4_ = (-(in_stack_00000010 * in_stack_00000034) * fVar6 +
                   -(in_stack_0000000c * in_stack_00000030) * fVar5 +
                   fVar6 * in_stack_00000014 * in_stack_00000030 +
                   in_stack_00000034 * in_stack_0000000c * fVar2 +
                   in_stack_00000010 * fVar16 * fVar5) - fVar2 * in_stack_00000014 * fVar16;
    auVar8._8_4_ = (-fVar17 * fVar5 +
                   fVar13 * fVar2 + fVar2 * fVar19 + fVar30 * fVar5 + fVar26 * fVar6) -
                   fVar6 * fVar20;
    auVar8._12_4_ =
         (fVar10 * fVar16 +
         fVar14 * in_stack_00000034 +
         fVar16 * fVar20 + fVar29 * in_stack_00000030 + in_stack_00000034 * fVar17) -
         in_stack_00000030 * fVar19;
    fVar30 = (fVar15 * -fVar17 +
             -fVar25 * in_stack_00000030 +
             fVar16 * fVar22 + fVar27 * fVar16 + fVar12 * in_stack_00000030 + fVar30 * fVar15) /
             fVar7;
    auVar9._4_4_ = fVar7;
    auVar9._0_4_ = fVar7;
    auVar9._8_4_ = fVar7;
    auVar9._12_4_ = fVar7;
    auVar9 = divps(auVar8,auVar9);
    *(undefined1 (*) [16])in_RDI->m = auVar9;
    auVar28._0_4_ =
         fVar2 * -(fVar15 * in_stack_00000024) +
         local_18 * -(in_stack_00000020 * in_stack_00000034) +
         -(in_stack_00000018 * in_stack_00000030) * fVar5 +
         local_18 * in_stack_00000024 * in_stack_00000030 +
         in_stack_00000034 * in_stack_00000018 * fVar2 + in_stack_00000020 * fVar15 * fVar5;
    auVar28._4_4_ =
         local_18 * -(in_stack_00000014 * in_stack_00000030) +
         fVar5 * -(in_stack_00000010 * fVar15) +
         -(in_stack_00000008 * in_stack_00000034) * fVar2 +
         fVar2 * in_stack_00000014 * fVar15 +
         in_stack_00000030 * in_stack_00000008 * fVar5 +
         in_stack_00000010 * in_stack_00000034 * local_18;
    auVar28._8_4_ =
         fVar2 * -fVar18 +
         local_18 * fVar10 + fVar22 * fVar5 + local_18 * fVar20 + fVar23 * fVar2 + fVar5 * fVar27;
    auVar28._12_4_ =
         fVar15 * -fVar20 +
         in_stack_00000034 * fVar11 +
         fVar24 * in_stack_00000030 +
         in_stack_00000030 * fVar18 + fVar21 * in_stack_00000034 + fVar15 * fVar26;
    auVar1._4_4_ = fVar7;
    auVar1._0_4_ = fVar7;
    auVar1._8_4_ = fVar7;
    auVar1._12_4_ = fVar7;
    auVar9 = divps(auVar28,auVar1);
    *(undefined1 (*) [16])(in_RDI->m + 4) = auVar9;
    auVar3._0_4_ = local_18 * -(in_stack_00000024 * fVar16) +
                   fVar5 * -(fVar15 * in_stack_0000001c) +
                   fVar6 * -(in_stack_00000034 * in_stack_00000018) +
                   fVar6 * fVar15 * in_stack_00000024 +
                   in_stack_00000018 * fVar16 * fVar5 +
                   local_18 * in_stack_0000001c * in_stack_00000034;
    auVar3._4_4_ = fVar6 * -(in_stack_00000014 * fVar15) +
                   local_18 * -(in_stack_00000034 * in_stack_0000000c) +
                   fVar5 * -(fVar16 * in_stack_00000008) +
                   local_18 * in_stack_00000014 * fVar16 +
                   in_stack_00000008 * in_stack_00000034 * fVar6 +
                   fVar15 * in_stack_0000000c * fVar5;
    auVar3._8_4_ = local_18 * -fVar19 +
                   fVar5 * -fVar25 +
                   fVar6 * fVar24 + fVar6 * fVar18 + fVar12 * fVar5 + fVar29 * local_18;
    auVar3._12_4_ =
         fVar16 * -fVar18 +
         fVar15 * fVar13 +
         in_stack_00000034 * -fVar12 +
         fVar15 * fVar19 + fVar23 * fVar16 + in_stack_00000034 * fVar25;
    auVar9 = divps(auVar3,auVar1);
    *(undefined1 (*) [16])(in_RDI->m + 8) = auVar9;
    auVar4._0_4_ = (((in_stack_00000020 * fVar16 * local_18 +
                     fVar6 * in_stack_00000018 * in_stack_00000030 +
                     fVar2 * fVar15 * in_stack_0000001c) - fVar2 * in_stack_00000018 * fVar16) -
                   local_18 * in_stack_00000030 * in_stack_0000001c) -
                   in_stack_00000020 * fVar15 * fVar6;
    auVar4._4_4_ = (((in_stack_00000010 * fVar15 * fVar6 +
                     fVar2 * fVar16 * in_stack_00000008 +
                     local_18 * in_stack_0000000c * in_stack_00000030) -
                    fVar6 * in_stack_00000030 * in_stack_00000008) -
                   fVar2 * fVar15 * in_stack_0000000c) - in_stack_00000010 * fVar16 * local_18;
    auVar4._8_4_ = (((local_18 * 0.0 + 0.0 + 0.0) - fVar16 * 0.0 * 0.0) - fVar6 * 0.0) -
                   in_stack_00000020 * 0.0 * 0.0;
    auVar4._12_4_ =
         (((fVar5 * 0.0 + 0.0 + 0.0) - fVar16 * 0.0 * 0.0) - fVar5 * fVar16 * 0.0) -
         in_stack_00000020 * 0.0 * 0.0;
    auVar9 = divps(auVar4,auVar1);
    *(long *)(in_RDI->m + 0xc) = auVar9._0_8_;
    in_RDI->m[0xe] =
         (fVar11 * fVar6 +
         fVar14 * local_18 + -fVar12 * fVar2 + fVar17 * local_18 + fVar21 * fVar6 + fVar25 * fVar2)
         / fVar7;
  }
  else {
    in_RDI->m[0] = 1.0;
    in_RDI->m[1] = 0.0;
    in_RDI->m[2] = 0.0;
    in_RDI->m[3] = 0.0;
    in_RDI->m[4] = 0.0;
    in_RDI->m[5] = 1.0;
    in_RDI->m[6] = 0.0;
    in_RDI->m[7] = 0.0;
    in_RDI->m[8] = 0.0;
    in_RDI->m[9] = 0.0;
    in_RDI->m[10] = 1.0;
    in_RDI->m[0xb] = 0.0;
    in_RDI->m[0xc] = 0.0;
    in_RDI->m[0xd] = 0.0;
    in_RDI->m[0xe] = 0.0;
    fVar30 = 1.0;
  }
  in_RDI->m[0xf] = fVar30;
  return in_RDI;
}

Assistant:

mat4 mat4_inverse(mat4 m) {
    float *a = m.m;

    float det =
        a[0] * a[5] * a[10] * a[15] +
        a[0] * a[6] * a[11] * a[13] +
        a[0] * a[7] * a[9] * a[14] +

        a[1] * a[4] * a[11] * a[14] +
        a[1] * a[6] * a[8] * a[15] +
        a[1] * a[7] * a[10] * a[12] +

        a[2] * a[4] * a[9] * a[15] +
        a[2] * a[5] * a[11] * a[12] +
        a[2] * a[7] * a[8] * a[13] +

        a[3] * a[4] * a[10] * a[13] +
        a[3] * a[5] * a[8] * a[14] +
        a[3] * a[6] * a[9] * a[12] -

        a[0] * a[5] * a[11] * a[14] -
        a[0] * a[6] * a[9] * a[15] -
        a[0] * a[7] * a[10] * a[13] -

        a[1] * a[4] * a[10] * a[15] -
        a[1] * a[6] * a[11] * a[12] -
        a[1] * a[7] * a[8] * a[14] -

        a[2] * a[4] * a[11] * a[13] -
        a[2] * a[5] * a[8] * a[15] -
        a[2] * a[7] * a[9] * a[12] -

        a[3] * a[4] * a[9] * a[14] -
        a[3] * a[5] * a[10] * a[12] -
        a[3] * a[6] * a[8] * a[13];

    if (det == 0.0) {
        return mat4_identity();
    }

    float a0 = a[5] * a[10] * a[15] + a[6] * a[11] * a[13] + a[7] * a[9] * a[14] - a[5] * a[11] * a[14] - a[6] * a[9] * a[15] - a[7] * a[10] * a[13];

    float a1 = a[1] * a[11] * a[14] + a[2] * a[9] * a[15] + a[3] * a[10] * a[13] - a[1] * a[10] * a[15] - a[2] * a[11] * a[13] - a[3] * a[9] * a[14];

    float a2 = a[1] * a[6] * a[15] + a[2] * a[7] * a[13] + a[3] * a[5] * a[14] - a[1] * a[7] * a[14] - a[2] * a[5] * a[15] - a[3] * a[6] * a[13];

    float a3 = a[1] * a[7] * a[10] + a[2] * a[5] * a[11] + a[3] * a[6] * a[9] - a[1] * a[6] * a[11] - a[2] * a[7] * a[9] - a[3] * a[5] * a[10];

    float a4 = a[4] * a[11] * a[14] + a[6] * a[8] * a[15] + a[7] * a[10] * a[12] - a[4] * a[10] * a[15] - a[6] * a[11] * a[12] - a[7] * a[8] * a[14];

    float a5 = a[0] * a[10] * a[15] + a[2] * a[11] * a[12] + a[3] * a[8] * a[14] - a[0] * a[11] * a[14] - a[2] * a[8] * a[15] - a[3] * a[10] * a[12];

    float a6 = a[0] * a[7] * a[14] + a[2] * a[4] * a[15] + a[3] * a[6] * a[12] - a[0] * a[6] * a[15] - a[2] * a[7] * a[12] - a[3] * a[4] * a[14];

    float a7 = a[0] * a[6] * a[11] + a[2] * a[7] * a[8] + a[3] * a[4] * a[10] - a[0] * a[7] * a[10] - a[2] * a[4] * a[11] - a[3] * a[6] * a[8];

    float a8 = a[4] * a[9] * a[15] + a[5] * a[11] * a[12] + a[7] * a[8] * a[13] - a[4] * a[11] * a[13] - a[5] * a[8] * a[15] - a[7] * a[9] * a[12];

    float a9 = a[0] * a[11] * a[13] + a[1] * a[8] * a[15] + a[3] * a[9] * a[12] - a[0] * a[9] * a[15] - a[1] * a[11] * a[12] - a[3] * a[8] * a[13];

    float a10 = a[0] * a[5] * a[15] + a[1] * a[7] * a[12] + a[3] * a[4] * a[13] - a[0] * a[7] * a[13] - a[1] * a[4] * a[15] - a[3] * a[5] * a[12];

    float a11 = a[0] * a[7] * a[9] + a[1] * a[4] * a[11] + a[3] * a[5] * a[8] - a[0] * a[5] * a[11] - a[1] * a[7] * a[8] - a[3] * a[4] * a[9];

    float a12 = a[4] * a[10] * a[13] + a[5] * a[8] * a[14] + a[6] * a[9] * a[12] - a[4] * a[9] * a[14] - a[5] * a[10] * a[12] - a[6] * a[8] * a[13];

    float a13 = a[0] * a[9] * a[14] + a[1] * a[10] * a[12] + a[2] * a[8] * a[13] - a[0] * a[10] * a[13] - a[1] * a[8] * a[14] - a[2] * a[9] * a[12];

    float a14 = a[0] * a[6] * a[13] + a[1] * a[4] * a[14] + a[2] * a[5] * a[12] - a[0] * a[5] * a[14] - a[1] * a[6] * a[12] - a[2] * a[4] * a[13];

    float a15 = a[0] * a[5] * a[10] + a[1] * a[6] * a[8] + a[2] * a[4] * a[9] - a[0] * a[6] * a[9] - a[1] * a[4] * a[10] - a[2] * a[5] * a[8];

    return mat4_create(
            a0 / det, a1 / det, a2 / det, a3 / det,
            a4 / det, a5 / det, a6 / det, a7 / det,
            a8 / det, a9 / det, a10 / det, a11 / det,
            a12 / det, a13 / det, a14 / det, a15 / det);
}